

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O2

uint256 * ComputeMerkleRoot(uint256 *__return_storage_ptr__,
                           vector<uint256,_std::allocator<uint256>_> hashes,bool *mutated)

{
  long lVar1;
  undefined8 uVar2;
  base_blob<256U> *pbVar3;
  bool bVar4;
  undefined1 *in_RDX;
  ulong uVar5;
  long lVar6;
  uchar *puVar7;
  uchar *out;
  undefined1 uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = 0;
  while( true ) {
    out = *(uchar **)mutated;
    puVar7 = *(uchar **)(mutated + 8);
    uVar5 = (long)puVar7 - (long)out;
    if (uVar5 < 0x21) break;
    if (in_RDX != (undefined1 *)0x0) {
      lVar6 = 0;
      for (uVar9 = 1; uVar5 = (long)puVar7 - (long)out, uVar9 < (ulong)((long)uVar5 >> 5);
          uVar9 = uVar9 + 2) {
        bVar4 = operator==((base_blob<256U> *)(out + lVar6),(base_blob<256U> *)(out + lVar6 + 0x20))
        ;
        if (bVar4) {
          uVar8 = 1;
        }
        out = *(uchar **)mutated;
        puVar7 = *(uchar **)(mutated + 8);
        lVar6 = lVar6 + 0x40;
      }
    }
    if ((uVar5 & 0x20) != 0) {
      std::vector<uint256,_std::allocator<uint256>_>::push_back
                ((vector<uint256,_std::allocator<uint256>_> *)mutated,(value_type *)(puVar7 + -0x20)
                );
      out = *(uchar **)mutated;
      uVar5 = *(long *)(mutated + 8) - (long)out;
    }
    SHA256D64(out,out,(ulong)((long)uVar5 >> 5) >> 1);
    std::vector<uint256,_std::allocator<uint256>_>::resize
              ((vector<uint256,_std::allocator<uint256>_> *)mutated,
               (ulong)(*(long *)(mutated + 8) - *(long *)mutated >> 5) >> 1);
  }
  if (in_RDX != (undefined1 *)0x0) {
    *in_RDX = uVar8;
  }
  if (puVar7 == out) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00152e6e;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    pbVar3 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar3->m_data)._M_elems[0x10] = '\0';
    (pbVar3->m_data)._M_elems[0x11] = '\0';
    (pbVar3->m_data)._M_elems[0x12] = '\0';
    (pbVar3->m_data)._M_elems[0x13] = '\0';
    (pbVar3->m_data)._M_elems[0x14] = '\0';
    (pbVar3->m_data)._M_elems[0x15] = '\0';
    (pbVar3->m_data)._M_elems[0x16] = '\0';
    (pbVar3->m_data)._M_elems[0x17] = '\0';
    pbVar3 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar3->m_data)._M_elems[0x18] = '\0';
    (pbVar3->m_data)._M_elems[0x19] = '\0';
    (pbVar3->m_data)._M_elems[0x1a] = '\0';
    (pbVar3->m_data)._M_elems[0x1b] = '\0';
    (pbVar3->m_data)._M_elems[0x1c] = '\0';
    (pbVar3->m_data)._M_elems[0x1d] = '\0';
    (pbVar3->m_data)._M_elems[0x1e] = '\0';
    (pbVar3->m_data)._M_elems[0x1f] = '\0';
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00152e6e:
      __stack_chk_fail();
    }
    uVar10 = *(undefined4 *)out;
    uVar11 = *(undefined4 *)(out + 4);
    uVar12 = *(undefined4 *)(out + 8);
    uVar13 = *(undefined4 *)(out + 0xc);
    uVar2 = *(undefined8 *)(out + 0x18);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)(out + 0x10);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar2;
  }
  *(undefined4 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar10;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 4) = uVar11;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar12;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0xc) = uVar13;
  return __return_storage_ptr__;
}

Assistant:

uint256 ComputeMerkleRoot(std::vector<uint256> hashes, bool* mutated) {
    bool mutation = false;
    while (hashes.size() > 1) {
        if (mutated) {
            for (size_t pos = 0; pos + 1 < hashes.size(); pos += 2) {
                if (hashes[pos] == hashes[pos + 1]) mutation = true;
            }
        }
        if (hashes.size() & 1) {
            hashes.push_back(hashes.back());
        }
        SHA256D64(hashes[0].begin(), hashes[0].begin(), hashes.size() / 2);
        hashes.resize(hashes.size() / 2);
    }
    if (mutated) *mutated = mutation;
    if (hashes.size() == 0) return uint256();
    return hashes[0];
}